

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  lua_State *L;
  int iVar4;
  int iVar5;
  int iVar6;
  
  pcVar2 = *argv;
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    progname = pcVar2;
  }
  iVar3 = listing;
  if (1 < argc) {
    iVar4 = 1;
    iVar5 = 0;
LAB_001038aa:
    pcVar2 = argv[iVar4];
    iVar6 = iVar5;
    if (*pcVar2 != '-') goto LAB_00103979;
    cVar1 = pcVar2[1];
    switch(cVar1) {
    case 'l':
      if (pcVar2[2] != '\0') break;
      iVar3 = iVar3 + 1;
      listing = iVar3;
LAB_00103965:
      iVar4 = iVar4 + 1;
      iVar6 = iVar5;
      if (argc <= iVar4) goto LAB_00103979;
      goto LAB_001038aa;
    case 'm':
    case 'n':
    case 'q':
    case 'r':
    case 't':
    case 'u':
      break;
    case 'o':
      if (pcVar2[2] != '\0') break;
      output = argv[(long)iVar4 + 1];
      if (output != (char *)0x0) {
        iVar4 = iVar4 + 1;
        if (*output == '-') {
          if (output[1] != '\0') goto LAB_00103a65;
          output = (char *)0x0;
        }
        else if (*output == '\0') goto LAB_00103a65;
        goto LAB_00103965;
      }
      goto LAB_00103a65;
    case 'p':
      if (pcVar2[2] == '\0') {
        dumping = 1;
        goto LAB_00103965;
      }
      break;
    case 's':
      if (pcVar2[2] == '\0') {
        stripping = 1;
        goto LAB_00103965;
      }
      break;
    case 'v':
      if (pcVar2[2] == '\0') {
        iVar5 = iVar5 + 1;
        goto LAB_00103965;
      }
      break;
    default:
      if (cVar1 == '\0') goto LAB_00103979;
      if ((cVar1 == '-') && (pcVar2[2] == '\0')) {
        iVar4 = iVar4 + 1;
        iVar6 = iVar5 + 1;
        if (iVar5 == 0) {
          iVar6 = iVar5;
        }
        goto LAB_00103979;
      }
    }
    usage(pcVar2);
LAB_00103a65:
    usage("\'-o\' needs argument");
    goto LAB_00103a71;
  }
  iVar4 = 1;
  iVar6 = 0;
LAB_00103979:
  if ((iVar4 == argc) && ((iVar3 != 0 || (iVar4 = argc, (dumping & 1) != 0)))) {
    dumping = 1;
    iVar4 = argc + -1;
    argv[(long)argc + -1] = Output;
  }
  if ((iVar6 != 0) &&
     (puts("Lua 5.4.7  Copyright (C) 1994-2024 Lua.org, PUC-Rio"), iVar6 == argc + -1))
  goto LAB_00103a87;
  if (argc - iVar4 == 0 || argc < iVar4) {
LAB_00103a71:
    usage("no input files given");
LAB_00103a7d:
    main_cold_2();
  }
  else {
    L = luaL_newstate();
    if (L == (lua_State *)0x0) goto LAB_00103a7d;
    lua_pushcclosure(L,pmain,0);
    lua_pushinteger(L,(ulong)(uint)(argc - iVar4));
    lua_pushlightuserdata(L,argv + iVar4);
    iVar3 = lua_pcallk(L,2,0,0,0,(lua_KFunction)0x0);
    if (iVar3 == 0) {
      lua_close(L);
      return 0;
    }
  }
  main_cold_1();
LAB_00103a87:
  exit(0);
}

Assistant:

int main(int argc, char* argv[])
{
 lua_State* L;
 int i=doargs(argc,argv);
 argc-=i; argv+=i;
 if (argc<=0) usage("no input files given");
 L=luaL_newstate();
 if (L==NULL) fatal("cannot create state: not enough memory");
 lua_pushcfunction(L,&pmain);
 lua_pushinteger(L,argc);
 lua_pushlightuserdata(L,argv);
 if (lua_pcall(L,2,0,0)!=LUA_OK) fatal(lua_tostring(L,-1));
 lua_close(L);
 return EXIT_SUCCESS;
}